

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O3

void test_bool(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined8 uVar6;
  undefined8 uVar7;
  long extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  undefined8 extraout_RAX_02;
  int extraout_var;
  long extraout_RAX_03;
  undefined8 extraout_RAX_04;
  undefined8 extraout_RAX_05;
  undefined8 extraout_RAX_06;
  undefined8 extraout_RAX_07;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  char *extraout_RAX_08;
  dirent *pdVar15;
  size_t sVar16;
  size_t sVar17;
  DIR *__dirp;
  FILE *__stream;
  long lVar18;
  char *pcVar19;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  ulong uVar20;
  char *pcVar21;
  DIR *__s;
  DIR *__name;
  char *pcVar22;
  DIR *paths;
  DIR *__filename;
  undefined1 *puVar23;
  char *pcVar24;
  char *pcVar25;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  _Bool b;
  undefined1 auStack_7608 [8];
  undefined1 auStack_7600 [504];
  ulong uStack_7408;
  DIR *pDStack_7400;
  dirent *pdStack_73f8;
  DIR *pDStack_73f0;
  DIR *pDStack_73e8;
  stat sStack_73e0;
  char acStack_7350 [512];
  size_t sStack_7150;
  dirent *pdStack_7148;
  DIR *pDStack_7140;
  char *pcStack_7138;
  code *pcStack_7130;
  char *pcStack_7128;
  ulong uStack_7120;
  char *pcStack_7118;
  DIR *pDStack_7110;
  code *pcStack_7108;
  undefined8 uStack_70d0;
  undefined1 *puStack_70c8;
  undefined1 *puStack_70c0;
  undefined1 auStack_70b0 [8];
  char *pcStack_70a8;
  char *pcStack_7098;
  char *pcStack_7090;
  undefined8 uStack_7088;
  undefined8 uStack_7070;
  DIR aDStack_7000 [25944];
  char *pcStack_aa8;
  char *pcStack_aa0;
  char *pcStack_a98;
  char *pcStack_a90;
  code *apcStack_a88 [2];
  undefined1 auStack_a78 [116];
  uint uStack_a04;
  char acStack_a00 [256];
  undefined8 uStack_900;
  char *pcStack_8f8;
  char *pcStack_8f0;
  char *pcStack_8e8;
  char *pcStack_8e0;
  char *pcStack_8d8;
  char *pcStack_8d0;
  undefined8 uStack_8c8;
  code *pcStack_8c0;
  char *pcStack_8b8;
  undefined8 uStack_8b0;
  char *pcStack_8a8;
  char *pcStack_8a0;
  char *pcStack_898;
  char *pcStack_890;
  code *pcStack_888;
  undefined8 uStack_880;
  undefined8 uStack_878;
  char *pcStack_870;
  char *pcStack_868;
  char *pcStack_860;
  undefined8 uStack_858;
  bson_t *pbStack_850;
  char *pcStack_848;
  code *pcStack_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  char *pcStack_820;
  char *pcStack_818;
  char *pcStack_810;
  char *pcStack_808;
  char *pcStack_800;
  code *pcStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined1 *puStack_7d8;
  char *pcStack_7d0;
  char *pcStack_7c8;
  code *pcStack_7c0;
  undefined8 uStack_7b8;
  ulong uStack_7b0;
  ulong uStack_7a8;
  undefined1 *puStack_7a0;
  char *pcStack_798;
  void *pvStack_790;
  code *pcStack_788;
  uint uStack_704;
  undefined1 auStack_700 [4];
  uint uStack_6fc;
  ulong uStack_5b0;
  ulong uStack_5a8;
  undefined1 *puStack_5a0;
  char *pcStack_598;
  void *pvStack_590;
  code *apcStack_588 [16];
  uint uStack_504;
  undefined1 auStack_500 [4];
  uint uStack_4fc;
  undefined8 uStack_3b8;
  ulong uStack_3b0;
  undefined1 *puStack_3a8;
  char *pcStack_3a0;
  undefined8 uStack_398;
  code *apcStack_390 [2];
  undefined8 uStack_380;
  code *pcStack_378;
  undefined8 uStack_368;
  code *pcStack_360;
  long lStack_358;
  undefined8 uStack_350;
  code *pcStack_348;
  undefined8 uStack_340;
  int iStack_338;
  int iStack_334;
  undefined8 uStack_330;
  char *pcStack_328;
  code *pcStack_320;
  int iStack_314;
  ulong uStack_310;
  code *pcStack_308;
  undefined8 uStack_300;
  uint uStack_28c;
  char *pcStack_288;
  undefined1 auStack_280 [4];
  uint uStack_27c;
  undefined8 uStack_128;
  char *pcStack_f8;
  undefined8 uStack_f0;
  code *pcStack_e8;
  char *pcStack_e0;
  undefined8 uStack_d8;
  code *pcStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_b8;
  char *pcStack_b0;
  undefined1 auStack_a4 [12];
  undefined8 uStack_98;
  char *pcStack_90;
  code *pcStack_88;
  undefined8 uStack_80;
  char *pcStack_70;
  char *pcStack_68;
  undefined8 uStack_60;
  char *pcStack_58;
  long lStack_30;
  undefined8 uStack_28;
  code *pcStack_20;
  char local_11;
  
  local_11 = (char)((ulong)in_RAX >> 0x38);
  pcStack_20 = (code *)0x13c9e7;
  uVar6 = bson_bcon_magic();
  pcStack_20 = (code *)0x13ca0b;
  uVar6 = bcon_new(0,"foo",uVar6,7,1,0);
  pcStack_20 = (code *)0x13ca13;
  uVar7 = bson_bcone_magic();
  pcStack_20 = (code *)0x13ca30;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,7,&local_11,0);
  if (cVar1 == '\0') {
    pcStack_20 = (code *)0x13ca50;
    test_bool_cold_1();
  }
  else if (local_11 != '\0') {
    pcStack_20 = (code *)0x13ca43;
    bson_destroy(uVar6);
    return;
  }
  pcStack_20 = test_date_time;
  test_bool_cold_2();
  pcStack_20 = (code *)0x1403a7;
  lStack_30 = extraout_RAX;
  uStack_28 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,8,10000,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,8,&lStack_30,0);
  if (cVar1 == '\0') {
    test_date_time_cold_1();
  }
  else if (lStack_30 == 10000) {
    bson_destroy(uVar6);
    return;
  }
  test_date_time_cold_2();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,9,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,9,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_null_cold_1();
  pcStack_58 = "foo";
  pcStack_88 = (code *)0x13cb3a;
  uStack_60 = uVar6;
  uVar6 = bson_bcon_magic();
  uStack_80 = 0;
  pcStack_88 = (code *)0x13cb6a;
  uVar6 = bcon_new(0,"foo",uVar6,10,"^foo|bar$","i");
  pcStack_88 = (code *)0x13cb72;
  uVar7 = bson_bcone_magic();
  uStack_80 = 0;
  pcStack_88 = (code *)0x13cb95;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,10,&pcStack_68,&pcStack_70);
  if (cVar1 == '\0') {
    pcStack_88 = (code *)0x13cbd5;
    test_regex_cold_1();
LAB_0013cbd5:
    pcStack_88 = (code *)0x13cbda;
    test_regex_cold_2();
  }
  else {
    pcStack_88 = (code *)0x13cbaa;
    iVar2 = strcmp(pcStack_68,"^foo|bar$");
    if (iVar2 != 0) goto LAB_0013cbd5;
    if ((*pcStack_70 == 'i') && (pcStack_70[1] == '\0')) {
      pcStack_88 = (code *)0x13cbc6;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_88 = test_dbpointer;
  test_regex_cold_3();
  pcStack_88 = (code *)0x0;
  pcStack_90 = "foo";
  pcStack_d0 = (code *)0x13cbfa;
  uStack_98 = uVar6;
  bson_oid_init(auStack_a4,0);
  pcStack_d0 = (code *)0x13cbff;
  uVar6 = bson_bcon_magic();
  uStack_c8 = 0;
  pcStack_d0 = (code *)0x13cc28;
  uVar6 = bcon_new(0,"foo",uVar6,0xb,"collection",auStack_a4);
  pcStack_d0 = (code *)0x13cc30;
  uVar7 = bson_bcone_magic();
  uStack_c8 = 0;
  pcStack_d0 = (code *)0x13cc53;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xb,&pcStack_b0,&uStack_b8);
  if (cVar1 == '\0') {
    pcStack_d0 = (code *)0x13cc96;
    test_dbpointer_cold_1();
LAB_0013cc96:
    pcStack_d0 = (code *)0x13cc9b;
    test_dbpointer_cold_2();
  }
  else {
    pcStack_d0 = (code *)0x13cc68;
    iVar2 = strcmp(pcStack_b0,"collection");
    if (iVar2 != 0) goto LAB_0013cc96;
    pcStack_d0 = (code *)0x13cc7b;
    cVar1 = bson_oid_equal(uStack_b8,auStack_a4);
    if (cVar1 != '\0') {
      pcStack_d0 = (code *)0x13cc87;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_d0 = test_code;
  test_dbpointer_cold_3();
  pcStack_d0 = (code *)0x1403a7;
  pcStack_e8 = (code *)0x13cca9;
  pcStack_e0 = extraout_RAX_00;
  uStack_d8 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_e8 = (code *)0x13ccce;
  uVar6 = bcon_new(0,"foo",uVar6,0xc,"var a = {};",0);
  pcStack_e8 = (code *)0x13ccd6;
  uVar7 = bson_bcone_magic();
  pcStack_e8 = (code *)0x13ccf1;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xc,&pcStack_e0,0);
  if (cVar1 == '\0') {
    pcStack_e8 = (code *)0x13cd1e;
    test_code_cold_1();
  }
  else {
    pcStack_e8 = (code *)0x13cd05;
    iVar2 = strcmp(pcStack_e0,"var a = {};");
    if (iVar2 == 0) {
      pcStack_e8 = (code *)0x13cd11;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_e8 = test_symbol;
  test_code_cold_2();
  pcStack_e8 = (code *)0x1403a7;
  pcStack_f8 = extraout_RAX_01;
  uStack_f0 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0xd,"symbol",0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xd,&pcStack_f8,0);
  if (cVar1 == '\0') {
    test_symbol_cold_1();
  }
  else {
    iVar2 = strcmp(pcStack_f8,"symbol");
    if (iVar2 == 0) {
      bson_destroy(uVar6);
      return;
    }
  }
  test_symbol_cold_2();
  pcStack_308 = (code *)0x13cdc3;
  uStack_128 = uVar6;
  pvVar8 = (void *)bson_bcon_magic();
  puVar23 = (undefined1 *)0x0;
  pcStack_308 = (code *)0x13cdea;
  uVar9 = bcon_new(0,"b",pvVar8,0xf,10,0);
  uStack_300 = 0;
  pcVar25 = "foo";
  pcStack_308 = (code *)0x13ce16;
  uVar10 = bcon_new(0,"foo",pvVar8,0xe,"var a = b;",uVar9);
  pcStack_308 = (code *)0x13ce1e;
  uVar6 = bson_bcone_magic();
  uStack_300 = 0;
  pcStack_308 = (code *)0x13ce44;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,0xe,&pcStack_288,auStack_280);
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x13cfdd;
    test_codewscope_cold_1();
LAB_0013cfdd:
    pcStack_308 = (code *)0x13cfe2;
    test_codewscope_cold_2();
  }
  else {
    pcStack_308 = (code *)0x13ce5d;
    iVar2 = strcmp(pcStack_288,"var a = b;");
    if (iVar2 != 0) goto LAB_0013cfdd;
    pcStack_308 = (code *)0x13ce75;
    pcVar25 = (char *)bson_get_data(auStack_280);
    pcStack_308 = (code *)0x13ce80;
    pvVar8 = (void *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_27c) {
      pcStack_308 = (code *)0x13ce94;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_308 = (code *)0x13cea4;
      pvVar12 = (void *)bson_get_data(auStack_280);
      pcStack_308 = (code *)0x13ceb2;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_308 = (code *)0x13cec3;
        bson_destroy(auStack_280);
        pcStack_308 = (code *)0x13cecb;
        bson_destroy(uVar9);
        pcStack_308 = (code *)0x13ced3;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar23 = auStack_280;
    pcStack_308 = (code *)0x13cef4;
    uVar10 = bson_as_canonical_extended_json(puVar23);
    pcStack_308 = (code *)0x13cf01;
    uVar6 = bson_as_canonical_extended_json(uVar9);
    uVar3 = *(uint *)(uVar9 + 4);
    if (uStack_27c != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (pcVar25[uVar20] != *(char *)((long)pvVar8 + uVar20)) goto LAB_0013cfd1;
        uVar20 = uVar20 + 1;
      } while (uStack_27c != (uint)uVar20);
    }
    uVar4 = uStack_27c;
    if (uStack_27c < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_308 = (code *)0x13cf4d;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar10,uVar6);
      pcStack_308 = (code *)0x13cf65;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar10 = (ulong)uVar3;
      pcStack_308 = (code *)0x13cf80;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_28c = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013cfe7;
      uVar10 = (ulong)uStack_27c;
      pcStack_308 = (code *)0x13cfaa;
      uVar20 = write(uVar3,pcVar25,uVar10);
      if (uVar20 != uVar10) goto LAB_0013cfec;
      uVar9 = (ulong)*(uint *)(uVar9 + 4);
      pcStack_308 = (code *)0x13cfc0;
      uVar20 = write(uVar4,pvVar8,uVar9);
      if (uVar20 != uVar9) goto LAB_0013cff1;
      uVar20 = (ulong)uVar4;
      pcStack_308 = (code *)0x13cfd1;
      test_codewscope_cold_5();
      uVar6 = extraout_RAX_02;
LAB_0013cfd1:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  pcStack_308 = (code *)0x13cfe7;
  test_codewscope_cold_7();
LAB_0013cfe7:
  pcStack_308 = (code *)0x13cfec;
  test_codewscope_cold_6();
LAB_0013cfec:
  pcStack_308 = (code *)0x13cff1;
  test_codewscope_cold_3();
LAB_0013cff1:
  pcStack_308 = test_int32;
  test_codewscope_cold_4();
  pcStack_320 = (code *)0x13cfff;
  uStack_310 = uVar9;
  pcStack_308 = (code *)pvVar8;
  iStack_314 = extraout_var;
  uVar6 = bson_bcon_magic();
  pcStack_320 = (code *)0x13d023;
  uVar6 = bcon_new(0,"foo",uVar6,0xf,10,0);
  pcStack_320 = (code *)0x13d02b;
  uVar7 = bson_bcone_magic();
  pcStack_320 = (code *)0x13d048;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xf,&iStack_314,0);
  if (cVar1 == '\0') {
    pcStack_320 = (code *)0x13d068;
    test_int32_cold_1();
  }
  else if (iStack_314 == 10) {
    pcStack_320 = (code *)0x13d05b;
    bson_destroy(uVar6);
    return;
  }
  pcStack_320 = test_timestamp;
  test_int32_cold_2();
  pcStack_328 = "foo";
  pcStack_348 = (code *)0x13d07b;
  uStack_330 = uVar6;
  pcStack_320 = (code *)pcVar25;
  uVar6 = bson_bcon_magic();
  pvVar8 = (void *)0x0;
  uStack_340 = 0;
  pcStack_348 = (code *)0x13d0a9;
  uVar6 = bcon_new(0,"foo",uVar6,0x10,100,1000);
  pcStack_348 = (code *)0x13d0b1;
  uVar7 = bson_bcone_magic();
  uStack_340 = 0;
  pcStack_348 = (code *)0x13d0d4;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x10,&iStack_334,&iStack_338);
  if (cVar1 == '\0') {
    pcStack_348 = (code *)0x13d100;
    test_timestamp_cold_1();
LAB_0013d100:
    pcStack_348 = (code *)0x13d105;
    test_timestamp_cold_2();
  }
  else {
    if (iStack_334 != 100) goto LAB_0013d100;
    if (iStack_338 == 1000) {
      pcStack_348 = (code *)0x13d0f1;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_348 = test_int64;
  test_timestamp_cold_3();
  pcStack_348 = (code *)0x1403a7;
  pcStack_360 = (code *)0x13d113;
  lStack_358 = extraout_RAX_03;
  uStack_350 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_360 = (code *)0x13d137;
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  pcStack_360 = (code *)0x13d13f;
  uVar7 = bson_bcone_magic();
  pcStack_360 = (code *)0x13d15a;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&lStack_358,0);
  if (cVar1 == '\0') {
    pcStack_360 = (code *)0x13d17a;
    test_int64_cold_1();
  }
  else if (lStack_358 == 10) {
    pcStack_360 = (code *)0x13d16d;
    bson_destroy(uVar6);
    return;
  }
  pcStack_360 = test_maxkey;
  test_int64_cold_2();
  pcStack_360 = (code *)0x1403a7;
  pcStack_378 = (code *)0x13d188;
  uStack_368 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_378 = (code *)0x13d1a6;
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  pcStack_378 = (code *)0x13d1ae;
  uVar7 = bson_bcone_magic();
  pcStack_378 = (code *)0x13d1c6;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_378 = test_minkey;
  test_maxkey_cold_1();
  pcStack_378 = (code *)0x1403a7;
  apcStack_390[0] = (code *)0x13d1e7;
  uStack_380 = uVar6;
  uVar6 = bson_bcon_magic();
  apcStack_390[0] = (code *)0x13d205;
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  apcStack_390[0] = (code *)0x13d20d;
  uVar7 = bson_bcone_magic();
  apcStack_390[0] = (code *)0x13d225;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  apcStack_390[0] = test_bson_document;
  test_minkey_cold_1();
  uStack_398 = 0;
  pcStack_3a0 = "foo";
  apcStack_588[0] = (code *)0x13d26e;
  uStack_3b8 = uVar6;
  uStack_3b0 = uVar10;
  puStack_3a8 = puVar23;
  apcStack_390[0] = (code *)&stack0xffffffffffffff00;
  uVar9 = bcon_new(0,"bar","baz",0);
  apcStack_588[0] = (code *)0x13d276;
  uVar6 = bson_bcon_magic();
  pcVar25 = "foo";
  apcStack_588[0] = (code *)0x13d297;
  uVar10 = bcon_new(0,"foo",uVar6,2,uVar9,0);
  apcStack_588[0] = (code *)0x13d29f;
  uVar6 = bson_bcone_magic();
  apcStack_588[0] = (code *)0x13d2bf;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,2,auStack_500,0);
  if (cVar1 == '\0') {
    apcStack_588[0] = (code *)0x13d43f;
    test_bson_document_cold_1();
  }
  else {
    apcStack_588[0] = (code *)0x13d2d7;
    pvVar8 = (void *)bson_get_data(auStack_500);
    apcStack_588[0] = (code *)0x13d2e2;
    pcVar25 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_4fc) {
      apcStack_588[0] = (code *)0x13d2f6;
      pvVar11 = (void *)bson_get_data(uVar9);
      apcStack_588[0] = (code *)0x13d306;
      pvVar12 = (void *)bson_get_data(auStack_500);
      apcStack_588[0] = (code *)0x13d314;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        apcStack_588[0] = (code *)0x13d325;
        bson_destroy(auStack_500);
        apcStack_588[0] = (code *)0x13d32d;
        bson_destroy(uVar9);
        apcStack_588[0] = (code *)0x13d335;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar23 = auStack_500;
    apcStack_588[0] = (code *)0x13d356;
    uVar10 = bson_as_canonical_extended_json(puVar23);
    apcStack_588[0] = (code *)0x13d363;
    uVar6 = bson_as_canonical_extended_json(uVar9);
    uVar3 = *(uint *)(uVar9 + 4);
    if (uStack_4fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar8 + uVar20) != pcVar25[uVar20]) goto LAB_0013d433;
        uVar20 = uVar20 + 1;
      } while (uStack_4fc != (uint)uVar20);
    }
    uVar4 = uStack_4fc;
    if (uStack_4fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_588[0] = (code *)0x13d3af;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar10,uVar6);
      apcStack_588[0] = (code *)0x13d3c7;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar10 = (ulong)uVar3;
      apcStack_588[0] = (code *)0x13d3e2;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_504 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d444;
      uVar10 = (ulong)uStack_4fc;
      apcStack_588[0] = (code *)0x13d40c;
      uVar20 = write(uVar3,pvVar8,uVar10);
      if (uVar20 != uVar10) goto LAB_0013d449;
      uVar9 = (ulong)*(uint *)(uVar9 + 4);
      apcStack_588[0] = (code *)0x13d422;
      uVar20 = write(uVar4,pcVar25,uVar9);
      if (uVar20 != uVar9) goto LAB_0013d44e;
      uVar20 = (ulong)uVar4;
      apcStack_588[0] = (code *)0x13d433;
      test_bson_document_cold_4();
      uVar6 = extraout_RAX_04;
LAB_0013d433:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  apcStack_588[0] = (code *)0x13d444;
  test_bson_document_cold_6();
LAB_0013d444:
  apcStack_588[0] = (code *)0x13d449;
  test_bson_document_cold_5();
LAB_0013d449:
  apcStack_588[0] = (code *)0x13d44e;
  test_bson_document_cold_2();
LAB_0013d44e:
  apcStack_588[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_788 = (code *)0x13d484;
  uStack_5b0 = uVar9;
  uStack_5a8 = uVar10;
  puStack_5a0 = puVar23;
  pcStack_598 = pcVar25;
  pvStack_590 = pvVar8;
  apcStack_588[0] = (code *)apcStack_390;
  uVar9 = bcon_new(0,"0","baz",0);
  pcStack_788 = (code *)0x13d48c;
  uVar6 = bson_bcon_magic();
  pcVar25 = "foo";
  pcStack_788 = (code *)0x13d4ad;
  uVar10 = bcon_new(0,"foo",uVar6,3,uVar9,0);
  pcStack_788 = (code *)0x13d4b5;
  uVar6 = bson_bcone_magic();
  pcStack_788 = (code *)0x13d4d5;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,3,auStack_700,0);
  if (cVar1 == '\0') {
    pcStack_788 = (code *)0x13d655;
    test_bson_array_cold_1();
  }
  else {
    pcStack_788 = (code *)0x13d4ed;
    pvVar8 = (void *)bson_get_data(auStack_700);
    pcStack_788 = (code *)0x13d4f8;
    pcVar25 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_6fc) {
      pcStack_788 = (code *)0x13d50c;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_788 = (code *)0x13d51c;
      pvVar12 = (void *)bson_get_data(auStack_700);
      pcStack_788 = (code *)0x13d52a;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_788 = (code *)0x13d53b;
        bson_destroy(auStack_700);
        pcStack_788 = (code *)0x13d543;
        bson_destroy(uVar9);
        pcStack_788 = (code *)0x13d54b;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar23 = auStack_700;
    pcStack_788 = (code *)0x13d56c;
    uVar10 = bson_as_canonical_extended_json(puVar23);
    pcStack_788 = (code *)0x13d579;
    uVar6 = bson_as_canonical_extended_json(uVar9);
    uVar3 = *(uint *)(uVar9 + 4);
    if (uStack_6fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar8 + uVar20) != pcVar25[uVar20]) goto LAB_0013d649;
        uVar20 = uVar20 + 1;
      } while (uStack_6fc != (uint)uVar20);
    }
    uVar4 = uStack_6fc;
    if (uStack_6fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_788 = (code *)0x13d5c5;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar10,uVar6);
      pcStack_788 = (code *)0x13d5dd;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      uVar10 = (ulong)uVar3;
      pcStack_788 = (code *)0x13d5f8;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_704 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar23 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013d65a;
      uVar10 = (ulong)uStack_6fc;
      pcStack_788 = (code *)0x13d622;
      uVar20 = write(uVar3,pvVar8,uVar10);
      if (uVar20 != uVar10) goto LAB_0013d65f;
      uVar9 = (ulong)*(uint *)(uVar9 + 4);
      pcStack_788 = (code *)0x13d638;
      uVar20 = write(uVar4,pcVar25,uVar9);
      if (uVar20 != uVar9) goto LAB_0013d664;
      uVar20 = (ulong)uVar4;
      pcStack_788 = (code *)0x13d649;
      test_bson_array_cold_4();
      uVar6 = extraout_RAX_05;
LAB_0013d649:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  pcStack_788 = (code *)0x13d65a;
  test_bson_array_cold_6();
LAB_0013d65a:
  pcStack_788 = (code *)0x13d65f;
  test_bson_array_cold_5();
LAB_0013d65f:
  pcStack_788 = (code *)0x13d664;
  test_bson_array_cold_2();
LAB_0013d664:
  pcStack_788 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_7c0 = (code *)0x13d679;
  uStack_7b8 = extraout_RAX_06;
  uStack_7b0 = uVar9;
  uStack_7a8 = uVar10;
  puStack_7a0 = puVar23;
  pcStack_798 = pcVar25;
  pvStack_790 = pvVar8;
  pcStack_788 = (code *)apcStack_588;
  uStack_7e8 = bson_bcon_magic();
  pcStack_7c8 = (char *)0x0;
  pcStack_7d0 = "]";
  puStack_7d8 = (undefined1 *)0x2;
  uStack_7e0 = 0xf;
  uStack_7f0 = 0x13d6c1;
  uVar6 = bcon_new(0,"foo","[",uStack_7e8,0xf,1);
  pcStack_7c0 = (code *)0x13d6cd;
  uStack_7e8 = bson_bcone_magic();
  pcStack_7c8 = (char *)0x0;
  pcStack_7d0 = "]";
  uStack_7e0 = 0xf;
  uStack_7f0 = 0x13d6fc;
  puStack_7d8 = (undefined1 *)&uStack_7b8;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_7e8,0xf,(long)&uStack_7b8 + 4);
  if (cVar1 == '\0') {
    pcStack_7c0 = (code *)0x13d72d;
    test_inline_array_cold_1();
LAB_0013d72d:
    pcStack_7c0 = (code *)0x13d732;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_7b8._4_4_ != 1) goto LAB_0013d72d;
    if ((int)uStack_7b8 == 2) {
      pcStack_7c0 = (code *)0x13d719;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_7c0 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_7c0 = (code *)0x14a05b;
  pcStack_7c8 = "[";
  pcStack_7d0 = "foo";
  puStack_7d8 = (undefined1 *)0x0;
  uStack_7e0 = 0xf;
  pcStack_7f8 = (code *)0x13d747;
  uStack_7f0 = extraout_RAX_07;
  uStack_7e8 = uVar6;
  pcStack_820 = (char *)bson_bcon_magic();
  pcStack_800 = (char *)0x0;
  pcStack_808 = "}";
  pcStack_810 = (char *)0x1;
  pcStack_818 = (char *)0xf;
  uStack_828 = "a";
  uStack_830 = 2;
  uStack_838 = 0x13d79a;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_820,0xf);
  pcStack_7f8 = (code *)0x13d7a6;
  pcStack_820 = (char *)bson_bcone_magic();
  uStack_830 = (long)&uStack_7f0 + 4;
  pcStack_800 = (char *)0x0;
  pcStack_808 = "}";
  pcStack_818 = (char *)0xf;
  uStack_828 = "b";
  uStack_838 = 0x13d7e9;
  pcStack_810 = (char *)&uStack_7f0;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_820,0xf);
  if (cVar1 == '\0') {
    pcStack_7f8 = (code *)0x13d81a;
    test_inline_doc_cold_1();
LAB_0013d81a:
    pcStack_7f8 = (code *)0x13d81f;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_7f0._4_4_ != 1) goto LAB_0013d81a;
    if ((int)uStack_7f0 == 2) {
      pcStack_7f8 = (code *)0x13d806;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_7f8 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_7f8 = (code *)0x0;
  pcStack_800 = "a";
  pcStack_810 = "{";
  pcStack_818 = "foo";
  pcStack_820 = "}";
  pcStack_840 = (code *)0x13d837;
  pcStack_808 = (char *)uVar6;
  uStack_878 = (undefined8 *)bson_bcon_magic();
  pcStack_840 = (code *)0x0;
  pcStack_848 = (char *)0x3;
  pbStack_850 = (bson_t *)0xf;
  pcStack_860 = "c";
  pcStack_868 = (char *)0x2;
  pcStack_870 = (char *)0xf;
  uStack_880 = 0x13d879;
  uStack_858 = uStack_878;
  bson = (bson_t *)bcon_new(0,"a",uStack_878,0xf,1,"b");
  pcStack_840 = (code *)0x13d885;
  pcStack_888 = (code *)bson_bcone_magic();
  pbStack_850 = (bson_t *)((long)&uStack_830 + 4);
  uStack_878 = &uStack_828;
  pcStack_848 = (char *)0x0;
  uStack_858 = 0xf;
  pcStack_868 = "c";
  pcStack_870 = (char *)0x0;
  uStack_880 = 0xf;
  pcStack_890 = "b";
  pcStack_898 = (char *)0x0;
  pcStack_8a0 = (char *)0x13d8d1;
  pcStack_860 = (char *)pcStack_888;
  test_extract_ctx_helper(bson,3,"a",pcStack_888,0xf,(long)&uStack_828 + 4);
  if (uStack_828._4_4_ == 1) {
    if ((int)uStack_828 != 2) goto LAB_0013d906;
    if (uStack_830._4_4_ == 3) {
      pcStack_840 = (code *)0x13d8f2;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_840 = (code *)0x13d906;
    test_extract_ctx_cold_1();
LAB_0013d906:
    pcStack_840 = (code *)0x13d90b;
    test_extract_ctx_cold_2();
  }
  pcStack_840 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_840 = (code *)0xf;
  pcStack_848 = "a";
  uStack_858 = 0;
  pcStack_868 = "c";
  pcStack_888 = (code *)0x13d923;
  pcStack_860 = (char *)((long)&uStack_828 + 4);
  pbStack_850 = bson;
  uStack_8b0 = bson_bcon_magic();
  pcStack_890 = (char *)0x0;
  pcStack_898 = "}";
  pcStack_8a0 = (char *)0xa;
  pcStack_8a8 = (char *)0xf;
  pcStack_8b8 = (char *)0x13d978;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_888 = (code *)0x13d984;
  uStack_8b0 = bson_bcone_magic();
  pcStack_8a0 = (char *)((long)&uStack_878 + 4);
  pcStack_890 = (char *)0x0;
  pcStack_898 = "}";
  pcStack_8a8 = (char *)0xf;
  pcStack_8b8 = "bar";
  pcStack_8c0 = (code *)0x141970;
  uStack_8c8 = 0x13d9c0;
  cVar1 = bcon_extract(uVar6,"hello",uStack_8b0,0,&pcStack_870,"foo");
  if (cVar1 == '\0') {
    pcStack_888 = (code *)0x13da00;
    test_nested_cold_1();
LAB_0013da00:
    pcStack_888 = (code *)0x13da05;
    test_nested_cold_2();
  }
  else {
    pcStack_888 = (code *)0x13d9d9;
    iVar2 = strcmp("world",pcStack_870);
    if (iVar2 != 0) goto LAB_0013da00;
    if (uStack_878._4_4_ == 10) {
      pcStack_888 = (code *)0x13d9ec;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_888 = test_skip;
  test_nested_cold_3();
  pcStack_888 = (code *)0x14ad57;
  pcStack_890 = "bar";
  pcStack_898 = (char *)0x0;
  pcStack_8a0 = "hello";
  pcStack_8a8 = "foo";
  pcStack_8c0 = (code *)0x13da1a;
  uStack_8b0 = uVar6;
  pcStack_8e8 = (char *)bson_bcon_magic();
  uStack_8c8 = 0;
  pcStack_8d0 = "}";
  pcStack_8d8 = (char *)0xa;
  pcStack_8e0 = (char *)0xf;
  pcStack_8f0 = (char *)0x13da6d;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_8c0 = (code *)0x13da79;
  pcVar25 = (char *)bson_bcone_magic();
  pcVar24 = "}";
  uStack_8c8 = 0;
  pcStack_8d0 = "}";
  pcStack_8d8 = (char *)0x10;
  pcStack_8e0 = (char *)0x1c;
  pcStack_8f0 = "bar";
  pcStack_8f8 = "{";
  uStack_900 = 0x13dab5;
  pcStack_8e8 = pcVar25;
  cVar1 = bcon_extract(uVar6,"hello",pcVar25,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_8c0 = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_8c8 = 0;
    pcStack_8d0 = "}";
    pcStack_8d8 = (char *)0x12;
    pcStack_8e0 = (char *)0x1c;
    pcStack_8f0 = "bar";
    pcStack_8f8 = "{";
    uStack_900 = 0x13daf4;
    pcStack_8e8 = pcVar25;
    cVar1 = bcon_extract(uVar6,"hello",pcVar25,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_8c0 = test_iter;
  test_skip_cold_2();
  pcStack_8c0 = (code *)0x14e902;
  pcStack_8d0 = "bar";
  pcStack_8d8 = "}";
  pcStack_8e8 = "{";
  apcStack_a88[0] = (code *)0x13db39;
  pcStack_8e0 = pcVar25;
  uStack_8c8 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_a88[0] = (code *)0x13db60;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_a88[0] = (code *)0x13db68;
  uVar6 = bson_bcone_magic();
  pcVar13 = acStack_a00;
  pcVar21 = "foo";
  pcVar19 = (char *)0x1d;
  uVar7 = 0;
  apcStack_a88[0] = (code *)0x13db88;
  pcVar22 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  if (cVar1 == '\0') {
    apcStack_a88[0] = (code *)0x13dd34;
    uVar6 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_a88[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar22 = acStack_a00;
    apcStack_a88[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar22 = acStack_a00;
    apcStack_a88[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar7 = 0;
      apcStack_a88[0] = (code *)0x13dbdf;
      __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_a00);
      apcStack_a88[0] = (code *)0x13dbea;
      pcVar25 = (char *)bson_get_data(__n_00);
      apcStack_a88[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n);
      if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
        apcStack_a88[0] = (code *)0x13dc09;
        pvVar8 = (void *)bson_get_data(__n);
        apcStack_a88[0] = (code *)0x13dc14;
        pvVar11 = (void *)bson_get_data(__n_00);
        apcStack_a88[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar8,pvVar11,(ulong)*(uint *)(__n + 4));
        if (iVar2 == 0) {
          apcStack_a88[0] = (code *)0x13dc2e;
          bson_destroy(__n);
          apcStack_a88[0] = (code *)0x13dc36;
          bson_destroy(__n_00);
          return;
        }
      }
      apcStack_a88[0] = (code *)0x13dc4f;
      pcVar24 = (char *)bson_as_canonical_extended_json(__n_00);
      apcStack_a88[0] = (code *)0x13dc5c;
      pcVar13 = (char *)bson_as_canonical_extended_json(__n);
      uVar3 = *(uint *)(__n_00 + 4);
      uVar4 = *(uint *)(__n + 4);
      uVar6 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar9 = 0;
        do {
          if (uVar4 == (uint)uVar9) break;
          if (pcVar25[uVar9] != __buf[uVar9]) goto LAB_0013dd28;
          uVar9 = uVar9 + 1;
        } while (uVar3 != (uint)uVar9);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar9 = (ulong)(uVar3 - 1);
      pcVar19 = pcVar24;
      while( true ) {
        apcStack_a88[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9);
        apcStack_a88[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar24 = (char *)(ulong)uVar3;
        pcVar22 = "failure.expected.bson";
        pcVar21 = (char *)0x42;
        apcStack_a88[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_a04 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar24 = (char *)(ulong)uVar4;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        pcVar22 = (char *)(ulong)uVar3;
        apcStack_a88[0] = (code *)0x13dd01;
        pcVar21 = pcVar25;
        pcVar14 = (char *)write(uVar3,pcVar25,(size_t)__n_00);
        if (pcVar14 != __n_00) goto LAB_0013dd48;
        __n = (char *)(ulong)*(uint *)(__n + 4);
        apcStack_a88[0] = (code *)0x13dd17;
        pcVar21 = __buf;
        pcVar22 = pcVar24;
        pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
        if (pcVar14 != __n) goto LAB_0013dd4d;
        uVar9 = (ulong)uVar4;
        apcStack_a88[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar13 = extraout_RAX_08;
LAB_0013dd28:
        uVar9 = uVar9 & 0xffffffff;
        pcVar19 = pcVar24;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_a88[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_a88[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_a88[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_a88[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_a88[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_70c0 = auStack_70b0;
  if (extraout_AL != '\0') {
    uStack_7070 = uVar6;
  }
  pcStack_7108 = (code *)0x13ddd5;
  pcStack_70a8 = pcVar21;
  pcStack_7098 = pcVar19;
  pcStack_7090 = pcVar13;
  uStack_7088 = uVar7;
  pcStack_aa8 = __n;
  pcStack_aa0 = pcVar25;
  pcStack_a98 = __buf;
  pcStack_a90 = __n_00;
  apcStack_a88[0] = (code *)&pcStack_8c0;
  bcon_extract_ctx_init(aDStack_7000);
  puStack_70c8 = auStack_a78;
  uStack_70d0 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_70a8) {
    uVar3 = (uint)pcStack_70a8;
    do {
      pcStack_7108 = (code *)0x13de41;
      __s = aDStack_7000;
      pcVar25 = pcVar22;
      cVar1 = bcon_extract_ctx_va(pcVar22,aDStack_7000,&uStack_70d0);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        pcStack_7108 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_7130 = (code *)0x13de73;
        __name = __s;
        pcStack_7128 = pcVar22;
        uStack_7120 = (ulong)uVar3;
        pcStack_7118 = pcVar24;
        pDStack_7110 = aDStack_7000;
        pcStack_7108 = (code *)&uStack_70d0;
        pdVar15 = (dirent *)strlen(pcVar25);
        pcStack_7130 = (code *)0x13de7e;
        paths = __s;
        sVar16 = strlen((char *)__s);
        if ((int)sVar16 + (int)pdVar15 < 499) {
          pcStack_7130 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_7130 = (code *)0x13dea8;
          strncat(__dest,pcVar25,(long)(int)pdVar15);
          pcStack_7130 = (code *)0x13deb0;
          sVar17 = strlen(__dest);
          (__dest + sVar17)[0] = '/';
          (__dest + sVar17)[1] = '\0';
          pcStack_7130 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar16);
          pcVar25 = __dest;
          do {
            if (*pcVar25 == '\\') {
              *pcVar25 = '/';
            }
            else if (*pcVar25 == '\0') {
              return;
            }
            pcVar25 = pcVar25 + 1;
          } while( true );
        }
        pcStack_7130 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar9 = (ulong)extraout_EDX;
        pDStack_73e8 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_7150 = sVar16;
        pdStack_7148 = pdVar15;
        pDStack_7140 = __s;
        pcStack_7138 = pcVar25;
        pcStack_7130 = (code *)apcStack_a88;
        __dirp = opendir((char *)__name);
        pDStack_73f0 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_73e8 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar15 = readdir(__dirp);
        do {
          if (pdVar15 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_73e8 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar9;
          if (iVar2 <= paths_index) {
            pDStack_73e8 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_73f0 = __dirp;
LAB_0013e018:
            pDStack_73e8 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_7408 = uVar9;
            pDStack_7400 = paths;
            pdStack_73f8 = pdVar15;
            pDStack_73e8 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar16 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar16) {
                pvVar8 = (void *)bson_malloc0(sVar16);
                sVar17 = fread(pvVar8,1,sVar16,__stream);
                if (sVar17 != sVar16) {
                  abort();
                }
                fclose(__stream);
                if (pvVar8 != (void *)0x0) {
                  lVar18 = bson_new_from_json(pvVar8,sVar16,auStack_7608);
                  if (lVar18 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7600);
                    abort();
                  }
                  bson_free(pvVar8);
                }
              }
            }
            return;
          }
          while ((pdVar15->d_name[0] == '.' &&
                 (((pdVar15->d_name[1] == '.' && (pdVar15->d_name[2] == '\0')) ||
                  (pdVar15->d_name[1] == '\0'))))) {
            pDStack_73e8 = (DIR *)0x13df58;
            pdVar15 = readdir(__dirp);
            if (pdVar15 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar25 = pdVar15->d_name;
          pDStack_73e8 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar25,acStack_7350);
          pDStack_73e8 = (DIR *)0x13df87;
          iVar5 = stat(pcVar25,&sStack_73e0);
          if ((iVar5 == 0) && ((sStack_73e0.st_mode & 0xf000) == 0x4000)) {
            pDStack_73e8 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_7350,paths_index,iVar2);
            uVar9 = (ulong)uVar3;
          }
          else {
            pDStack_73e8 = (DIR *)0x13dfc4;
            pcVar24 = strstr(pcVar25,".json");
            if (pcVar24 != (char *)0x0) {
              uVar9 = (ulong)(paths_index + 1);
              pDStack_73e8 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar25,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_73e8 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar15 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_bool (void)
{
   bool b;

   bson_t *bcon = BCON_NEW ("foo", BCON_BOOL (true));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_BOOL (b)));

   BSON_ASSERT (b == true);

   bson_destroy (bcon);
}